

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

LatticeComparison __thiscall
wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>_>::compare
          (Stack<wasm::analysis::Flat<unsigned_int>_> *this,Element *a,Element *b)

{
  bool bVar1;
  LatticeComparison LVar2;
  reference a_00;
  reference b_00;
  bool local_79;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  const_reverse_iterator itB;
  const_reverse_iterator itA;
  LatticeComparison result;
  Element *b_local;
  Element *a_local;
  Stack<wasm::analysis::Flat<unsigned_int>_> *this_local;
  
  itA.current._M_current._4_4_ = EQUAL;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::rbegin((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)&itB);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::rbegin((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)local_40);
  while( true ) {
    std::
    vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
    ::rend((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)(local_50 + 8));
    bVar1 = std::operator!=(&itB,(reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                                  *)(local_50 + 8));
    local_79 = true;
    if (!bVar1) {
      std::
      vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
      ::rend((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
              *)local_50);
      local_79 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                                  *)local_40,
                                 (reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                                  *)local_50);
    }
    if (local_79 == false) {
      return itA.current._M_current._4_4_;
    }
    std::
    vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
    ::rend((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)(local_60 + 8));
    bVar1 = std::operator==(&itB,(reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                                  *)(local_60 + 8));
    if (bVar1) {
      return LESS;
    }
    std::
    vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
    ::rend((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)local_60);
    bVar1 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                             *)local_40,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                             *)local_60);
    if (bVar1) break;
    a_00 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
           ::operator*(&itB);
    b_00 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                        *)local_40);
    LVar2 = Flat<unsigned_int>::compare((Flat<unsigned_int> *)this,a_00,b_00);
    switch(LVar2) {
    case NO_RELATION:
      return NO_RELATION;
    case EQUAL:
      break;
    case LESS:
      if (itA.current._M_current._4_4_ == GREATER) {
        return NO_RELATION;
      }
      itA.current._M_current._4_4_ = LESS;
      break;
    case GREATER:
      if (itA.current._M_current._4_4_ == LESS) {
        return NO_RELATION;
      }
      itA.current._M_current._4_4_ = GREATER;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
    ::operator++(&itB);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>_>
                  *)local_40);
  }
  return GREATER;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    auto result = EQUAL;
    // Iterate starting from the end of the vectors to match up the tops of
    // stacks with different sizes.
    for (auto itA = a.rbegin(), itB = b.rbegin();
         itA != a.rend() || itB != b.rend();
         ++itA, ++itB) {
      if (itA == a.rend()) {
        // The rest of A's elements are bottom, but B has a non-bottom element
        // because of our invariant that the base of the materialized stack must
        // not be bottom.
        return LESS;
      }
      if (itB == b.rend()) {
        // The rest of B's elements are bottom, but A has a non-bottom element.
        return GREATER;
      }
      switch (lattice.compare(*itA, *itB)) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }